

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::provider::AbstractProvider::ContinuouslyConnectLoop(AbstractProvider *this)

{
  bool bVar1;
  element_type *this_00;
  int local_1c;
  duration<long,_std::ratio<1L,_1L>_> local_18;
  AbstractProvider *local_10;
  AbstractProvider *this_local;
  
  local_10 = this;
  while (bVar1 = IsRunning(this), bVar1) {
    CreateConnection(this);
    bVar1 = IsRunning(this);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)Log);
      spdlog::logger::info<>(this_00,"will reconnect in 10 seconds");
      local_1c = 10;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_18,&local_1c);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_18);
    }
  }
  return;
}

Assistant:

void AbstractProvider::ContinuouslyConnectLoop()
{
    while (IsRunning())
    {
        CreateConnection();
        if (IsRunning())
        {
            Log->info("will reconnect in 10 seconds");
            std::this_thread::sleep_for(std::chrono::seconds(10));
        }
    }
}